

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

int nghttp3_qpack_decoder_set_max_dtable_capacity
              (nghttp3_qpack_decoder *decoder,size_t max_dtable_capacity)

{
  long *plVar1;
  size_t sVar2;
  nghttp3_mem *in_RSI;
  nghttp3_ringbuf *in_RDI;
  nghttp3_mem *mem;
  nghttp3_qpack_context *ctx;
  size_t i;
  nghttp3_qpack_entry *ent;
  uint8_t *ptr;
  int local_4;
  
  ptr = in_RDI[1].buf;
  if ((nghttp3_mem *)in_RDI[1].size < in_RSI) {
    local_4 = -0x65;
  }
  else {
    in_RDI[1].first = (size_t)in_RSI;
    while (in_RSI < in_RDI[1].mem) {
      if (in_RDI->len == 0) {
        __assert_fail("i",
                      "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                      ,0xc3e,
                      "int nghttp3_qpack_decoder_set_max_dtable_capacity(nghttp3_qpack_decoder *, size_t)"
                     );
      }
      plVar1 = (long *)nghttp3_ringbuf_get(in_RDI,(size_t)ptr);
      sVar2 = table_space(*(size_t *)(*(long *)*plVar1 + 0x10),
                          *(size_t *)(((long *)*plVar1)[1] + 0x10));
      in_RDI[1].mem = (nghttp3_mem *)((long)in_RDI[1].mem - sVar2);
      nghttp3_ringbuf_pop_back((nghttp3_ringbuf *)0x10f1a1);
      nghttp3_qpack_entry_free((nghttp3_qpack_entry *)0x10f1ab);
      nghttp3_mem_free((nghttp3_mem *)in_RDI,ptr);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp3_qpack_decoder_set_max_dtable_capacity(
  nghttp3_qpack_decoder *decoder, size_t max_dtable_capacity) {
  nghttp3_qpack_entry *ent;
  size_t i;
  nghttp3_qpack_context *ctx = &decoder->ctx;
  const nghttp3_mem *mem = ctx->mem;

  if (max_dtable_capacity > decoder->ctx.hard_max_dtable_capacity) {
    return NGHTTP3_ERR_INVALID_ARGUMENT;
  }

  ctx->max_dtable_capacity = max_dtable_capacity;

  while (ctx->dtable_size > max_dtable_capacity) {
    i = nghttp3_ringbuf_len(&ctx->dtable);
    assert(i);
    ent = *(nghttp3_qpack_entry **)nghttp3_ringbuf_get(&ctx->dtable, i - 1);

    ctx->dtable_size -= table_space(ent->nv.name->len, ent->nv.value->len);

    nghttp3_ringbuf_pop_back(&ctx->dtable);
    nghttp3_qpack_entry_free(ent);
    nghttp3_mem_free(mem, ent);
  }

  return 0;
}